

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.cpp
# Opt level: O2

int main(void)

{
  Children *this;
  _Head_base<0UL,_Kompositum::Component_*,_false> _Var1;
  long *plVar2;
  pointer *__ptr;
  Printer printer;
  _Head_base<0UL,_Kompositum::Component_*,_false> local_78;
  _Head_base<0UL,_Kompositum::Component_*,_false> local_70;
  _Head_base<0UL,_Kompositum::Component_*,_false> local_68;
  _Head_base<0UL,_Kompositum::Component_*,_false> local_60;
  long *local_58;
  _Head_base<0UL,_Kompositum::Component_*,_false> local_50;
  _Head_base<0UL,_Kompositum::Component_*,_false> local_48;
  _Head_base<0UL,_Kompositum::Component_*,_false> local_40;
  Composite composite;
  
  composite.super_Component.uid = 1;
  composite.super_Component._vptr_Component = (_func_int **)&PTR__Composite_00103cf0;
  composite.children.
  super__Vector_base<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>,_std::allocator<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  composite.children.
  super__Vector_base<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>,_std::allocator<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  composite.children.
  super__Vector_base<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>,_std::allocator<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_head_impl = (Component *)0x2;
  Kompositum::make_unique<Kompositum::Leaf,unsigned_long_long>
            ((Kompositum *)&printer,(unsigned_long_long *)&local_78);
  local_40._M_head_impl = (Component *)printer.super_Visitor;
  printer.super_Visitor._vptr_Visitor = (_func_int **)0x0;
  this = &composite.children;
  std::
  vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
  ::emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
            ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
              *)this,(unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>
                      *)&local_40);
  if (local_40._M_head_impl != (Component *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Component[1])();
  }
  local_40._M_head_impl = (Component *)0x0;
  if (printer.super_Visitor._vptr_Visitor != (_func_int **)0x0) {
    (**(code **)(*printer.super_Visitor._vptr_Visitor + 8))();
  }
  local_78._M_head_impl = (Component *)0x3;
  Kompositum::make_unique<Kompositum::Composite,unsigned_long_long>
            ((Kompositum *)&printer,(unsigned_long_long *)&local_78);
  local_48._M_head_impl = (Component *)printer.super_Visitor;
  printer.super_Visitor._vptr_Visitor = (_func_int **)0x0;
  std::
  vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
  ::emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
            ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
              *)this,(unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>
                      *)&local_48);
  if (local_48._M_head_impl != (Component *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Component[1])();
  }
  local_48._M_head_impl = (Component *)0x0;
  if (printer.super_Visitor._vptr_Visitor != (_func_int **)0x0) {
    (**(code **)(*printer.super_Visitor._vptr_Visitor + 8))();
  }
  printer.super_Visitor._vptr_Visitor = (_func_int **)&DAT_00000004;
  Kompositum::make_unique<Kompositum::Composite,unsigned_long_long>
            ((Kompositum *)&local_78,(unsigned_long_long *)&printer);
  _Var1._M_head_impl = local_78._M_head_impl;
  local_58 = (long *)0x5;
  Kompositum::make_unique<Kompositum::Leaf,unsigned_long_long>
            ((Kompositum *)&printer,(unsigned_long_long *)&local_58);
  local_50._M_head_impl = (Component *)printer.super_Visitor;
  printer.super_Visitor._vptr_Visitor = (_func_int **)0x0;
  std::
  vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
  ::emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
            ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
              *)(_Var1._M_head_impl + 1),
             (unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> *)
             &local_50);
  if (local_50._M_head_impl != (Component *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Component[1])();
  }
  local_50._M_head_impl = (Component *)0x0;
  if (printer.super_Visitor._vptr_Visitor != (_func_int **)0x0) {
    (**(code **)(*printer.super_Visitor._vptr_Visitor + 8))();
  }
  _Var1._M_head_impl = local_78._M_head_impl;
  local_58 = (long *)0x6;
  Kompositum::make_unique<Kompositum::Leaf,unsigned_long_long>
            ((Kompositum *)&printer,(unsigned_long_long *)&local_58);
  local_60._M_head_impl = (Component *)printer.super_Visitor;
  printer.super_Visitor._vptr_Visitor = (_func_int **)0x0;
  std::
  vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
  ::emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
            ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
              *)(_Var1._M_head_impl + 1),
             (unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> *)
             &local_60);
  if (local_60._M_head_impl != (Component *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Component[1])();
  }
  local_60._M_head_impl = (Component *)0x0;
  if (printer.super_Visitor._vptr_Visitor != (_func_int **)0x0) {
    (**(code **)(*printer.super_Visitor._vptr_Visitor + 8))();
  }
  local_68._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (Component *)0x0;
  std::
  vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
  ::emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
            ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
              *)this,(unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>
                      *)&local_68);
  if (local_68._M_head_impl != (Component *)0x0) {
    (*(local_68._M_head_impl)->_vptr_Component[1])();
  }
  local_68._M_head_impl = (Component *)0x0;
  local_58 = (long *)&DAT_00000007;
  Kompositum::make_unique<Kompositum::Leaf,unsigned_long_long>
            ((Kompositum *)&printer,(unsigned_long_long *)&local_58);
  local_70._M_head_impl = (Component *)printer.super_Visitor;
  printer.super_Visitor._vptr_Visitor = (_func_int **)0x0;
  std::
  vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
  ::emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
            ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
              *)this,(unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>
                      *)&local_70);
  if (local_70._M_head_impl != (Component *)0x0) {
    (*(local_70._M_head_impl)->_vptr_Component[1])();
  }
  local_70._M_head_impl = (Component *)0x0;
  if (printer.super_Visitor._vptr_Visitor != (_func_int **)0x0) {
    (**(code **)(*printer.super_Visitor._vptr_Visitor + 8))();
  }
  printer.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_00103d40;
  printer.indent = 0;
  Kompositum::Printer::visit(&printer,&composite);
  Kompositum::buildComposite((Kompositum *)&local_58,1,&kTreeDef);
  plVar2 = local_58;
  printer.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_00103d40;
  printer.indent = 0;
  (**(code **)(*local_58 + 0x10))(local_58);
  (**(code **)(*plVar2 + 8))(plVar2);
  if (local_78._M_head_impl != (Component *)0x0) {
    (*(local_78._M_head_impl)->_vptr_Component[1])();
  }
  Kompositum::Composite::~Composite(&composite);
  return 0;
}

Assistant:

int main(void) {
    Composite composite(1);

    composite.addChild(make_unique<Leaf>(2ull));
    composite.addChild(make_unique<Composite>(3ull));

    auto composite4 = make_unique<Composite>(4ull);
    composite4->addChild(make_unique<Leaf>(5ull));
    composite4->addChild(make_unique<Leaf>(6ull));

    composite.addChild(std::move(composite4));

    composite.addChild(make_unique<Leaf>(7ull));

    {
        Printer printer;
        composite.accept(printer);
    }

    auto componentTree = buildComposite(1, kTreeDef);

    {
        Printer printer;
        componentTree->accept(printer);
    }
}